

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

Vec_Int_t * Pdr_InvCounts(Vec_Int_t *vInv)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *p;
  Vec_Int_t *vCounts;
  int *pList;
  int *pCube;
  int k;
  int i;
  Vec_Int_t *vInv_local;
  
  piVar2 = Vec_IntArray(vInv);
  iVar1 = Vec_IntEntryLast(vInv);
  p = Vec_IntStart(iVar1);
  pList = piVar2 + 1;
  for (pCube._4_4_ = 0; pCube._4_4_ < *piVar2; pCube._4_4_ = pCube._4_4_ + 1) {
    for (pCube._0_4_ = 0; (int)pCube < *pList; pCube._0_4_ = (int)pCube + 1) {
      iVar1 = Abc_Lit2Var(pList[(int)pCube + 1]);
      Vec_IntAddToEntry(p,iVar1,1);
    }
    pList = pList + (*pList + 1);
  }
  return p;
}

Assistant:

Vec_Int_t * Pdr_InvCounts( Vec_Int_t * vInv )
{
    int i, k, * pCube, * pList = Vec_IntArray(vInv);
    Vec_Int_t * vCounts = Vec_IntStart( Vec_IntEntryLast(vInv) );
    Pdr_ForEachCube( pList, pCube, i )
        for ( k = 0; k < pCube[0]; k++ )
            Vec_IntAddToEntry( vCounts, Abc_Lit2Var(pCube[k+1]), 1 );
    return vCounts;
}